

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O1

void z_sqrt(complex *r,complex *z)

{
  float fVar1;
  float fVar2;
  double dVar3;
  
  fVar2 = f__cabs(z->r,z->i);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar1 = z->r;
    if (fVar1 <= 0.0) {
      dVar3 = (double)(fVar2 - fVar1) * 0.5;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      r->i = (float)dVar3;
      if (z->i <= 0.0 && z->i != 0.0) {
        r->i = -(float)dVar3;
      }
      r->r = (z->i / r->i) * 0.5;
    }
    else {
      dVar3 = (double)(fVar2 + fVar1) * 0.5;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      r->r = (float)dVar3;
      r->i = (z->i / (float)dVar3) * 0.5;
    }
  }
  else {
    r->r = 0.0;
    r->i = 0.0;
  }
  return;
}

Assistant:

void
z_sqrt(complex * r, complex * z)
#endif
{
    float mag;

    if ((mag = f__cabs(z->r, z->i)) == 0.)
        r->r = r->i = 0.;
    else if (z->r > 0) {
        r->r = sqrt(0.5 * (mag + z->r));
        r->i = z->i / r->r / 2;
    }
    else {
        r->i = sqrt(0.5 * (mag - z->r));
        if (z->i < 0)
            r->i = -r->i;
        r->r = z->i / r->i / 2;
    }
}